

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O0

int nn_condvar_wait(nn_condvar_t *cond,nn_mutex_t *lock,int timeout)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  int in_EDX;
  pthread_mutex_t *in_RSI;
  pthread_cond_t *in_RDI;
  timespec ts;
  timeval tv;
  int rc;
  int in_stack_ffffffffffffffac;
  timespec local_40;
  timeval local_30;
  uint local_20;
  int local_1c;
  pthread_mutex_t *local_18;
  pthread_cond_t *local_10;
  int local_4;
  
  if (in_EDX < 0) {
    pthread_cond_wait(in_RDI,in_RSI);
    local_4 = 0;
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_20 = gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    if (local_20 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(in_stack_ffffffffffffffac);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)local_20,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/condvar.c"
              ,0x74);
      fflush(_stderr);
      nn_err_abort();
    }
    local_30.tv_sec = local_1c / 1000 + local_30.tv_sec;
    local_30.tv_usec = (local_1c % 1000) * 1000 + local_30.tv_usec;
    local_40.tv_sec = local_30.tv_sec + local_30.tv_usec / 1000000;
    local_40.tv_nsec = (local_30.tv_usec % 1000000) * 1000;
    iVar1 = pthread_cond_timedwait(local_10,local_18,&local_40);
    if (iVar1 == 0x6e) {
      local_4 = -0x6e;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nn_condvar_wait (nn_condvar_t *cond, nn_mutex_t *lock, int timeout)
{
    int rc;
    struct timeval tv;
    struct timespec ts;

    if (timeout < 0) {
        /*  This is an infinite sleep.  We don't care about return values,
            as any error we can treat as just a premature wakeup. */
        (void) pthread_cond_wait (&cond->cv, &lock->mutex);
        return (0);
    }

    rc = gettimeofday(&tv, NULL);
    errnum_assert (rc == 0, rc);

    /* There are extra operations performed here, but they are done to avoid
       wrap of the tv_usec and ts_nsec members on 32-bit systems. */
    tv.tv_sec += timeout / 1000;
    tv.tv_usec += (timeout % 1000) * 1000;

    ts.tv_sec = tv.tv_sec + (tv.tv_usec / 1000000);
    ts.tv_nsec = (tv.tv_usec % 1000000) * 1000;

    rc = pthread_cond_timedwait (&cond->cv, &lock->mutex, &ts);
    if (rc == ETIMEDOUT)
        return (-ETIMEDOUT);
    /* Treat all other cases (including errors) as normal wakeup. */
    return (0);
}